

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

bb_insn_t_conflict add_new_bb_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,bb_t_conflict bb,int append_p)

{
  bb_insn_t pbVar1;
  uint uVar2;
  bb_insn_t_conflict pbVar3;
  bb_insn_t_conflict extraout_RAX;
  MIR_insn_t extraout_RDX;
  DLIST_LINK_bb_insn_t *pDVar4;
  gen_ctx_t gen_ctx_00;
  
  pbVar3 = create_bb_insn(gen_ctx,insn,bb);
  gen_ctx_00 = (gen_ctx_t)&bb->bb_insns;
  if (append_p != 0) {
    DLIST_bb_insn_t_append((DLIST_bb_insn_t *)gen_ctx_00,pbVar3);
    return extraout_RAX;
  }
  pbVar1 = ((DLIST_bb_insn_t *)gen_ctx_00)->head;
  if (pbVar1 == (bb_insn_t)0x0) {
    if ((bb->bb_insns).tail != (bb_insn_t)0x0) goto LAB_0015f1a4;
    pDVar4 = (DLIST_LINK_bb_insn_t *)&(bb->bb_insns).tail;
  }
  else {
    if ((pbVar1->bb_insn_link).prev != (bb_insn_t)0x0) {
      add_new_bb_insn_cold_1();
LAB_0015f1a4:
      add_new_bb_insn_cold_2();
      uVar2 = *(int *)&insn->field_0x18 - 0xa7;
      pbVar3 = (bb_insn_t_conflict)(ulong)uVar2;
      if ((uVar2 < 0xe) && ((0x2007U >> (uVar2 & 0x1f) & 1) != 0)) {
        pbVar3 = (bb_insn_t_conflict)malloc(0x10);
        if (pbVar3 == (bb_insn_t_conflict)0x0) {
          util_error(gen_ctx_00,"no memory");
        }
        insn->data = pbVar3;
        pbVar3->insn = extraout_RDX;
        pbVar3->gvn_val_const_p = '\0';
        pbVar3->alloca_flag = '\0';
        *(undefined2 *)&pbVar3->field_0xa = 0;
        pbVar3->index = 0;
      }
      else {
        insn->data = extraout_RDX;
      }
      return pbVar3;
    }
    pDVar4 = &pbVar1->bb_insn_link;
  }
  pDVar4->prev = pbVar3;
  (pbVar3->bb_insn_link).prev = (bb_insn_t)0x0;
  (pbVar3->bb_insn_link).next = pbVar1;
  ((DLIST_bb_insn_t *)gen_ctx_00)->head = pbVar3;
  return pbVar3;
}

Assistant:

static bb_insn_t add_new_bb_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, bb_t bb, int append_p) {
  bb_insn_t bb_insn = create_bb_insn (gen_ctx, insn, bb);

  if (append_p)
    DLIST_APPEND (bb_insn_t, bb->bb_insns, bb_insn);
  else
    DLIST_PREPEND (bb_insn_t, bb->bb_insns, bb_insn);
  return bb_insn;
}